

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> __thiscall
wabt::MakeUnique<wabt::TableModuleField,wabt::Location>(wabt *this,Location *args)

{
  TableModuleField *this_00;
  
  this_00 = (TableModuleField *)operator_new(0x80);
  TableModuleField::TableModuleField(this_00,args,(string_view)ZEXT816(0));
  *(TableModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}